

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O3

void __thiscall
jsonnet::internal::FixIndentation::fields
          (FixIndentation *this,ObjectFields *fields,Indent *indent,bool space_before)

{
  uint all_but_last_indent;
  pointer pFVar1;
  AST *pAVar2;
  uint uVar3;
  uint uVar4;
  AST *pAVar5;
  pointer pOVar6;
  bool bVar7;
  Indent new_indent2;
  Indent local_40;
  pointer local_38;
  
  pOVar6 = (fields->
           super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_38 = (fields->
             super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (pOVar6 != local_38) {
    all_but_last_indent = indent->lineUp;
    bVar7 = true;
    do {
      if (!bVar7) {
        this->column = this->column + 1;
      }
      switch(pOVar6->kind) {
      case ASSERT:
        fill(this,&pOVar6->fodder1,(bool)((~bVar7 | space_before) & 1),true,all_but_last_indent,
             all_but_last_indent);
        uVar3 = this->column;
        this->column = uVar3 + 6;
        pAVar5 = pOVar6->expr2;
        pAVar2 = left_recursive_deep(pAVar5);
        pFVar1 = (pAVar2->openFodder).
                 super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (((pAVar2->openFodder).
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             ._M_impl.super__Vector_impl_data._M_finish == pFVar1) || (pFVar1->kind == INTERSTITIAL)
           ) {
          uVar4 = indent->base;
          uVar3 = uVar3 + 7;
        }
        else {
          uVar4 = (this->opts).indent + indent->base;
          uVar3 = uVar4;
        }
        local_40.lineUp = uVar3;
        local_40.base = uVar4;
        expr(this,pAVar5,indent,true);
        if (pOVar6->expr3 == (AST *)0x0) goto switchD_001afe85_default;
        fill(this,&pOVar6->opFodder,true,true,local_40.lineUp,local_40.lineUp);
        this->column = this->column + 1;
        pAVar5 = pOVar6->expr3;
        goto LAB_001b00f8;
      case FIELD_ID:
        fill(this,&pOVar6->fodder1,(bool)((~bVar7 | space_before) & 1),true,all_but_last_indent,
             all_but_last_indent);
        this->column = this->column + (int)(pOVar6->id->name)._M_string_length;
        break;
      case FIELD_EXPR:
        fill(this,&pOVar6->fodder1,(bool)((~bVar7 | space_before) & 1),true,all_but_last_indent,
             all_but_last_indent);
        this->column = this->column + 1;
        expr(this,pOVar6->expr1,indent,false);
        fill(this,&pOVar6->fodder2,false,false,all_but_last_indent,all_but_last_indent);
        this->column = this->column + 1;
        break;
      case FIELD_STR:
        expr(this,pOVar6->expr1,indent,(bool)((~bVar7 | space_before) & 1));
        break;
      case LOCAL:
        fill(this,&pOVar6->fodder1,(bool)((~bVar7 | space_before) & 1),true,indent->lineUp,
             indent->lineUp);
        this->column = this->column + 5;
        fill(this,&pOVar6->fodder2,true,true,indent->lineUp,indent->lineUp);
        this->column = this->column + (int)(pOVar6->id->name)._M_string_length;
        if (pOVar6->methodSugar == true) {
          params(this,&pOVar6->fodderL,&pOVar6->params,pOVar6->trailingComma,&pOVar6->fodderR,indent
                );
        }
        fill(this,&pOVar6->opFodder,true,true,indent->lineUp,indent->lineUp);
        uVar3 = this->column + 1;
        goto LAB_001b00b3;
      default:
        goto switchD_001afe85_default;
      }
      if (pOVar6->methodSugar == true) {
        params(this,&pOVar6->fodderL,&pOVar6->params,pOVar6->trailingComma,&pOVar6->fodderR,indent);
      }
      fill(this,&pOVar6->opFodder,false,false,all_but_last_indent,all_but_last_indent);
      if (pOVar6->superSugar == true) {
        this->column = this->column + 1;
      }
      uVar3 = this->column;
      if ((ulong)pOVar6->hide < 3) {
        uVar3 = uVar3 + *(int *)(&DAT_0020a360 + (ulong)pOVar6->hide * 4);
LAB_001b00b3:
        this->column = uVar3;
      }
      pAVar5 = pOVar6->expr2;
      pAVar2 = left_recursive_deep(pAVar5);
      pFVar1 = (pAVar2->openFodder).
               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (((pAVar2->openFodder).
           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           ._M_impl.super__Vector_impl_data._M_finish == pFVar1) || (pFVar1->kind == INTERSTITIAL))
      {
        uVar4 = indent->base;
      }
      else {
        uVar4 = (this->opts).indent + indent->base;
        uVar3 = uVar4;
      }
      local_40.lineUp = uVar3;
      local_40.base = uVar4;
LAB_001b00f8:
      expr(this,pAVar5,&local_40,true);
switchD_001afe85_default:
      bVar7 = false;
      fill(this,&pOVar6->commaFodder,false,false,all_but_last_indent,all_but_last_indent);
      pOVar6 = pOVar6 + 1;
    } while (pOVar6 != local_38);
  }
  return;
}

Assistant:

void fields(ObjectFields &fields, const Indent &indent, bool space_before)
    {
        unsigned new_indent = indent.lineUp;
        bool first = true;
        for (auto &field : fields) {
            if (!first)
                column++;  // ','

            switch (field.kind) {
                case ObjectField::LOCAL: {
                    fill(field.fodder1, !first || space_before, true, indent.lineUp);
                    column += 5;  // local
                    fill(field.fodder2, true, true, indent.lineUp);
                    column += field.id->name.length();
                    fieldParams(field, indent);
                    fill(field.opFodder, true, true, indent.lineUp);
                    column++;  // =
                    Indent new_indent2 = newIndent(open_fodder(field.expr2), indent, column);
                    expr(field.expr2, new_indent2, true);
                } break;

                case ObjectField::FIELD_ID:
                case ObjectField::FIELD_STR:
                case ObjectField::FIELD_EXPR: {
                    if (field.kind == ObjectField::FIELD_ID) {
                        fill(field.fodder1, !first || space_before, true, new_indent);
                        column += field.id->name.length();

                    } else if (field.kind == ObjectField::FIELD_STR) {
                        expr(field.expr1, indent, !first || space_before);

                    } else if (field.kind == ObjectField::FIELD_EXPR) {
                        fill(field.fodder1, !first || space_before, true, new_indent);
                        column++;  // [
                        expr(field.expr1, indent, false);
                        fill(field.fodder2, false, false, new_indent);
                        column++;  // ]
                    }

                    fieldParams(field, indent);

                    fill(field.opFodder, false, false, new_indent);

                    if (field.superSugar)
                        column++;
                    switch (field.hide) {
                        case ObjectField::INHERIT: column += 1; break;
                        case ObjectField::HIDDEN: column += 2; break;
                        case ObjectField::VISIBLE: column += 3; break;
                    }
                    Indent new_indent2 = newIndent(open_fodder(field.expr2), indent, column);
                    expr(field.expr2, new_indent2, true);

                } break;

                case ObjectField::ASSERT: {
                    fill(field.fodder1, !first || space_before, true, new_indent);
                    column += 6;  // assert
                    // + 1 for the space after the assert
                    Indent new_indent2 = newIndent(open_fodder(field.expr2), indent, column + 1);
                    expr(field.expr2, indent, true);
                    if (field.expr3 != nullptr) {
                        fill(field.opFodder, true, true, new_indent2.lineUp);
                        column++;  // ":"
                        expr(field.expr3, new_indent2, true);
                    }
                } break;
            }

            first = false;
            fill(field.commaFodder, false, false, new_indent);
        }
    }